

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int BIO_s_custom_write(BIO *bio,char *data,int length)

{
  int iVar1;
  long lVar2;
  uint msg_more;
  
  lVar2 = BIO_get_data();
  msg_more = (uint)(length == 0x401d || *(int *)(lVar2 + 0x24) != 0);
  *(uint *)(lVar2 + 0x20) = msg_more;
  iVar1 = us_socket_write(0,*(us_socket_t **)(lVar2 + 0x18),data,length,msg_more);
  if (iVar1 == 0) {
    BIO_set_flags((BIO *)bio,10);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int BIO_s_custom_write(BIO *bio, const char *data, int length) {
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) BIO_get_data(bio);

    //printf("BIO_s_custom_write\n");

    loop_ssl_data->last_write_was_msg_more = loop_ssl_data->msg_more || length == 16413;
    int written = us_socket_write(0, loop_ssl_data->ssl_socket, data, length, loop_ssl_data->last_write_was_msg_more);

    if (!written) {
        BIO_set_flags(bio, BIO_FLAGS_SHOULD_RETRY | BIO_FLAGS_WRITE);
        return -1;
    }

    //printf("BIO_s_custom_write returns: %d\n", ret);

    return written;
}